

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::BarDataDrawer::DrawData
          (BarDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  Trafo *pTVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  long local_68;
  long theI;
  int theHeight;
  int theWidth;
  int theTop;
  int theLeft;
  int theTraY0;
  int theTraY;
  int theTraX;
  PRect *inRect_local;
  AxisSetup *inXAxisSetup_local;
  PlotDataSelection *inPlotDataSelection_local;
  PlotDataBase *inYData_local;
  PlotDataBase *inXData_local;
  BarDataDrawer *this_local;
  
  if (((this->super_DataDrawerBase).mXTrafo == (Trafo *)0x0) ||
     ((this->super_DataDrawerBase).mYTrafo == (Trafo *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    lVar3 = PlotDataBase::GetSize(inXData);
    lVar4 = PlotDataBase::GetSize(inYData);
    if (lVar4 < lVar3) {
      this_local._7_1_ = false;
    }
    else if ((this->super_DataDrawerBase).mPlotCount == 0) {
      this_local._7_1_ = false;
    }
    else if (((this->super_DataDrawerBase).field_0x24 & 1) == 0) {
      (*((this->super_DataDrawerBase).mYTrafo)->_vptr_Trafo[2])(0);
      lVar3 = inRect->mW;
      lVar4 = PlotDataBase::GetSize(inXData);
      uVar5 = lVar3 / lVar4;
      local_68 = 0;
      while( true ) {
        lVar3 = PlotDataBase::GetSize(inXData);
        if (lVar3 <= local_68) break;
        pTVar1 = (this->super_DataDrawerBase).mXTrafo;
        PlotDataBase::GetValue(inXData,local_68);
        (*pTVar1->_vptr_Trafo[2])();
        pTVar1 = (this->super_DataDrawerBase).mYTrafo;
        PlotDataBase::GetValue(inYData,local_68);
        (*pTVar1->_vptr_Trafo[2])();
        (*inPainter->_vptr_Painter[1])
                  (inPainter,(ulong)(uint)((int)extraout_XMM0_Da_00 - (int)uVar5 / 2),
                   (ulong)(uint)(int)extraout_XMM0_Da_01,uVar5 & 0xffffffff,
                   (ulong)(uint)((int)extraout_XMM0_Da - (int)extraout_XMM0_Da_01));
        local_68 = local_68 + 1;
      }
      this_local._7_1_ = true;
    }
    else {
      iVar2 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                        (this,inXData,inYData,inPlotDataSelection,inXAxisSetup,inRect,inPainter);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BarDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if (inXData.GetSize ()>inYData.GetSize ()) {
        return false;
      }
      if (!mPlotCount) {
          return false;
      }
      if (mDrawOnlyLastPoint) {
        return DrawOnlyLastPoint (inXData, inYData, inPlotDataSelection, inXAxisSetup, inRect, inPainter);
      }

      int theTraX, theTraY;
      int theTraY0 = mYTrafo->Transform (0);

      int theLeft, theTop, theWidth, theHeight;

      theWidth = inRect.mW/inXData.GetSize ();
      
      for (long theI=0;theI<inXData.GetSize ();theI++) {
        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        theTraY = mYTrafo->Transform (inYData.GetValue (theI));

        theLeft = theTraX-theWidth/2;
        theTop = theTraY;
        theHeight = theTraY0-theTop;

        inPainter.FillRect (theLeft, theTop, theWidth, theHeight);
      }
      return true;
    }